

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O0

void __thiscall Assimp::B3DImporter::ReadBRUS(B3DImporter *this)

{
  uint uVar1;
  int iVar2;
  aiMaterial *this_00;
  pointer paVar3;
  size_type sVar4;
  reference pString;
  float _r;
  aiVector3D aVar5;
  undefined1 local_8f0 [8];
  aiString texname;
  int local_4c4;
  int texid;
  int i_1;
  int i;
  float specpow;
  aiColor3D speccolor;
  aiString ainame;
  unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> mat;
  int fx;
  float shiny;
  float alpha;
  float local_88;
  undefined1 local_80 [8];
  aiVector3D color;
  string name;
  allocator<char> local_39;
  string local_38;
  int local_14;
  B3DImporter *pBStack_10;
  int n_texs;
  B3DImporter *this_local;
  
  pBStack_10 = this;
  local_14 = ReadInt(this);
  if ((local_14 < 0) || (8 < local_14)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Bad texture count",&local_39);
    Fail(this,&local_38);
  }
  do {
    uVar1 = ChunkSize(this);
    if (uVar1 == 0) {
      return;
    }
    ReadString_abi_cxx11_((string *)&color.z,this);
    aVar5 = ReadVec3(this);
    local_88 = aVar5.z;
    _shiny = aVar5._0_8_;
    local_80 = (undefined1  [8])_shiny;
    color.x = local_88;
    fx = (int)ReadFloat(this);
    _r = ReadFloat(this);
    ReadInt(this);
    uVar1 = ReadInt(this);
    this_00 = (aiMaterial *)operator_new(0x10);
    aiMaterial::aiMaterial(this_00);
    std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>::
    unique_ptr<std::default_delete<aiMaterial>,void>
              ((unique_ptr<aiMaterial,std::default_delete<aiMaterial>> *)(ainame.data + 0x3f8),
               this_00);
    aiString::aiString((aiString *)&speccolor.g,(string *)&color.z);
    paVar3 = std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>::operator->
                       ((unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> *)
                        (ainame.data + 0x3f8));
    aiMaterial::AddProperty(paVar3,(aiString *)&speccolor.g,"?mat.name",0,0);
    paVar3 = std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>::operator->
                       ((unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> *)
                        (ainame.data + 0x3f8));
    aiMaterial::AddProperty(paVar3,(aiVector3D *)local_80,1,"$clr.diffuse",0,0);
    paVar3 = std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>::operator->
                       ((unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> *)
                        (ainame.data + 0x3f8));
    aiMaterial::AddProperty(paVar3,(float *)&fx,1,"$mat.opacity",0,0);
    aiColor3D::aiColor3D((aiColor3D *)&i,_r,_r,_r);
    paVar3 = std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>::operator->
                       ((unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> *)
                        (ainame.data + 0x3f8));
    aiMaterial::AddProperty(paVar3,(aiColor3D *)&i,1,"$clr.specular",0,0);
    i_1 = (int)(_r * 128.0);
    paVar3 = std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>::operator->
                       ((unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> *)
                        (ainame.data + 0x3f8));
    aiMaterial::AddProperty(paVar3,(float *)&i_1,1,"$mat.shininess",0,0);
    if ((uVar1 & 0x10) != 0) {
      texid = 1;
      paVar3 = std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>::operator->
                         ((unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> *)
                          (ainame.data + 0x3f8));
      aiMaterial::AddProperty(paVar3,&texid,1,"$mat.twosided",0,0);
    }
    for (local_4c4 = 0; local_4c4 < local_14; local_4c4 = local_4c4 + 1) {
      iVar2 = ReadInt(this);
      if ((iVar2 < -1) ||
         ((-1 < iVar2 &&
          (sVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size(&this->_textures), (int)sVar4 <= iVar2)))) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(texname.data + 0x3fc),"Bad texture id",
                   (allocator<char> *)(texname.data + 0x3fb));
        Fail(this,(string *)(texname.data + 0x3fc));
      }
      if ((local_4c4 == 0) && (-1 < iVar2)) {
        pString = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](&this->_textures,(long)iVar2);
        aiString::aiString((aiString *)local_8f0,pString);
        paVar3 = std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>::operator->
                           ((unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> *)
                            (ainame.data + 0x3f8));
        aiMaterial::AddProperty(paVar3,(aiString *)local_8f0,"$tex.file",1,0);
      }
    }
    std::
    vector<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>,std::allocator<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>>>
    ::emplace_back<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>>
              ((vector<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>,std::allocator<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>>>
                *)&this->_materials,
               (unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> *)(ainame.data + 0x3f8));
    std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>::~unique_ptr
              ((unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> *)(ainame.data + 0x3f8));
    std::__cxx11::string::~string((string *)&color.z);
  } while( true );
}

Assistant:

void B3DImporter::ReadBRUS(){
    int n_texs=ReadInt();
    if( n_texs<0 || n_texs>8 ){
        Fail( "Bad texture count" );
    }
    while( ChunkSize() ){
        string name=ReadString();
        aiVector3D color=ReadVec3();
        float alpha=ReadFloat();
        float shiny=ReadFloat();
        /*int blend=**/ReadInt();
        int fx=ReadInt();

        std::unique_ptr<aiMaterial> mat(new aiMaterial);

        // Name
        aiString ainame( name );
        mat->AddProperty( &ainame,AI_MATKEY_NAME );

        // Diffuse color
        mat->AddProperty( &color,1,AI_MATKEY_COLOR_DIFFUSE );

        // Opacity
        mat->AddProperty( &alpha,1,AI_MATKEY_OPACITY );

        // Specular color
        aiColor3D speccolor( shiny,shiny,shiny );
        mat->AddProperty( &speccolor,1,AI_MATKEY_COLOR_SPECULAR );

        // Specular power
        float specpow=shiny*128;
        mat->AddProperty( &specpow,1,AI_MATKEY_SHININESS );

        // Double sided
        if( fx & 0x10 ){
            int i=1;
            mat->AddProperty( &i,1,AI_MATKEY_TWOSIDED );
        }

        //Textures
        for( int i=0;i<n_texs;++i ){
            int texid=ReadInt();
            if( texid<-1 || (texid>=0 && texid>=static_cast<int>(_textures.size())) ){
                Fail( "Bad texture id" );
            }
            if( i==0 && texid>=0 ){
                aiString texname( _textures[texid] );
                mat->AddProperty( &texname,AI_MATKEY_TEXTURE_DIFFUSE(0) );
            }
        }
        _materials.emplace_back( std::move(mat) );
    }
}